

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O0

void __thiscall
cfd::core::ElementsConfidentialAddress::DecodeAddress
          (ElementsConfidentialAddress *this,string *confidential_address,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *prefix_list)

{
  bool bVar1;
  undefined4 uVar2;
  pointer this_00;
  bool bVar3;
  ulong uVar4;
  reference this_01;
  undefined8 uVar5;
  undefined8 uVar6;
  uchar *puVar7;
  size_type sVar8;
  undefined8 uVar9;
  CfdException *pCVar10;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *wally_string;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  allocator local_4c9;
  string local_4c8;
  CfdSourceLocation local_4a8;
  undefined1 local_48a;
  allocator local_489;
  string local_488;
  CfdSourceLocation local_468 [4];
  CfdException *except;
  Pubkey local_3f0;
  Address local_3d8;
  string local_260;
  CfdSourceLocation local_240;
  string local_228;
  char *local_208;
  CfdSourceLocation local_200;
  string local_1e8;
  CfdSourceLocation local_1c8;
  CfdSourceLocation local_1b0;
  CfdSourceLocation local_198;
  CfdSourceLocation local_180;
  string local_168;
  reference local_148;
  ElementsBlindAddressFormat *format;
  __normal_iterator<cfd::core::ElementsBlindAddressFormat_*,_std::vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>_>
  local_138;
  iterator __end3;
  iterator __begin3;
  vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
  *__range3;
  AddressFormatData *data;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *__range2;
  undefined1 local_e0 [7];
  bool is_find_blinded_prefix;
  string hrp;
  int local_b8;
  uint32_t prefix;
  int ret;
  CfdSourceLocation local_90;
  WallyUtil *local_78;
  char *output;
  string address;
  allocator<unsigned_char> local_39;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_data;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *prefix_list_local;
  string *confidential_address_local;
  ElementsConfidentialAddress *this_local;
  
  pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)prefix_list;
  ::std::allocator<unsigned_char>::allocator(&local_39);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0x21,&local_39);
  ::std::allocator<unsigned_char>::~allocator(&local_39);
  ::std::__cxx11::string::string((string *)&output);
  local_78 = (WallyUtil *)0x0;
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x83;
    local_90.funcname = "DecodeAddress";
    logger::warn<std::__cxx11::string_const&>
              (&local_90,"DecodeAddress error. confidential address empty. : address={}.",
               confidential_address);
    prefix._2_1_ = 1;
    pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&ret,"DecodeAddress confidential address empty.",
               (allocator *)((long)&prefix + 3));
    CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,(string *)&ret);
    prefix._2_1_ = 0;
    __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_b8 = -1;
  hrp.field_2._12_4_ = 0;
  ::std::__cxx11::string::string((string *)local_e0);
  this_00 = pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  bVar1 = false;
  __end2 = ::std::
           vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
           begin((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)pubkey_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  data = (AddressFormatData *)
         ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
         ::end((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                *)this_00);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
                                *)&data);
    if (!bVar3) {
      if (!bVar1) {
        local_4a8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                     ,0x2f);
        local_4a8.filename = local_4a8.filename + 1;
        local_4a8.line = 0xe1;
        local_4a8.funcname = "DecodeAddress";
        logger::warn<std::__cxx11::string_const&>
                  (&local_4a8,
                   "DecodeAddress error. ConfidentialAddress prefix not registed. : address={}.",
                   confidential_address);
        pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_4c8,"DecodeAddress confidential address prefix not registed.",
                   &local_4c9);
        CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_4c8);
        __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_468[0].filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                   ,0x2f);
      local_468[0].filename = local_468[0].filename + 1;
      local_468[0].line = 0xd8;
      local_468[0].funcname = "DecodeAddress";
      logger::warn<std::__cxx11::string_const&>
                (local_468,
                 "DecodeAddress error. ConfidentialAddress prefix not found. : address={}.",
                 confidential_address);
      local_48a = 1;
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_488,"DecodeAddress confidential address prefix not found.",
                 &local_489);
      CfdException::CfdException(pCVar10,kCfdIllegalArgumentError,&local_488);
      local_48a = 0;
      __cxa_throw(pCVar10,&CfdException::typeinfo,CfdException::~CfdException);
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
              ::operator*(&__end2);
    GetBlindKeyPair();
    __end3 = ::std::
             vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
             ::begin((vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                      *)&__begin3);
    local_138._M_current =
         (ElementsBlindAddressFormat *)
         ::std::
         vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
         ::end((vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
                *)&__begin3);
    while (bVar3 = __gnu_cxx::operator!=(&__end3,&local_138), bVar3) {
      local_148 = __gnu_cxx::
                  __normal_iterator<cfd::core::ElementsBlindAddressFormat_*,_std::vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>_>
                  ::operator*(&__end3);
      local_78 = (WallyUtil *)0x0;
      if ((local_148->is_segwit & 1U) == 0) {
        hrp.field_2._12_4_ = AddressFormatData::GetValue(this_01,&local_148->blinded_prefix_key);
        uVar5 = ::std::__cxx11::string::c_str();
        uVar2 = hrp.field_2._12_4_;
        puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        local_b8 = wally_confidential_addr_to_ec_public_key(uVar5,uVar2,puVar7,sVar8);
        wally_string = extraout_RDX_01;
        if (local_b8 != 0) {
          local_1b0.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                       ,0x2f);
          local_1b0.filename = local_1b0.filename + 1;
          local_1b0.line = 0xa9;
          local_1b0.funcname = "DecodeAddress";
          logger::trace<int&,unsigned_int&>
                    (&local_1b0,"fail libwally. ret={} prefix={}",&local_b8,
                     (uint *)(hrp.field_2._M_local_buf + 0xc));
          local_1c8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                       ,0x2f);
          local_1c8.filename = local_1c8.filename + 1;
          local_1c8.line = 0xac;
          local_1c8.funcname = "DecodeAddress";
          logger::trace<std::__cxx11::string_const&>
                    (&local_1c8,"confidential_address={}",confidential_address);
          wally_string = extraout_RDX_02;
        }
      }
      else {
        AddressFormatData::GetString(&local_168,this_01,&local_148->blinded_prefix_key);
        ::std::__cxx11::string::operator=((string *)local_e0,(string *)&local_168);
        ::std::__cxx11::string::~string((string *)&local_168);
        uVar5 = ::std::__cxx11::string::c_str();
        uVar6 = ::std::__cxx11::string::c_str();
        puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        sVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        local_b8 = wally_confidential_addr_segwit_to_ec_public_key(uVar5,uVar6,puVar7,sVar8);
        wally_string = extraout_RDX;
        if (local_b8 != 0) {
          local_180.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                       ,0x2f);
          local_180.filename = local_180.filename + 1;
          local_180.line = 0x9c;
          local_180.funcname = "DecodeAddress";
          logger::trace<int&,std::__cxx11::string&>
                    (&local_180,"fail libwally. ret={} prefix={}",&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
          local_198.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                       ,0x2f);
          local_198.filename = local_198.filename + 1;
          local_198.line = 0x9e;
          local_198.funcname = "DecodeAddress";
          logger::trace<std::__cxx11::string_const&>
                    (&local_198,"confidential_address={}",confidential_address);
          wally_string = extraout_RDX_00;
        }
      }
      bVar1 = true;
      if (local_b8 == 0) {
        if ((local_148->is_segwit & 1U) == 0) {
          uVar5 = ::std::__cxx11::string::c_str();
          local_b8 = wally_confidential_addr_to_addr(uVar5,hrp.field_2._12_4_,&local_78);
          wally_string = extraout_RDX_05;
          if (local_b8 != 0) {
            local_240.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                         ,0x2f);
            local_240.filename = local_240.filename + 1;
            local_240.line = 0xc1;
            local_240.funcname = "DecodeAddress";
            logger::trace<int&,unsigned_int&>
                      (&local_240,"fail libwally. ret={} prefix={}",&local_b8,
                       (uint *)(hrp.field_2._M_local_buf + 0xc));
            wally_string = extraout_RDX_06;
          }
        }
        else {
          uVar5 = ::std::__cxx11::string::c_str();
          uVar6 = ::std::__cxx11::string::c_str();
          AddressFormatData::GetString(&local_1e8,this_01,&local_148->prefix_key);
          uVar9 = ::std::__cxx11::string::c_str();
          local_b8 = wally_confidential_addr_to_addr_segwit(uVar5,uVar6,uVar9,&local_78);
          ::std::__cxx11::string::~string((string *)&local_1e8);
          wally_string = extraout_RDX_03;
          if (local_b8 != 0) {
            local_200.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_address.cpp"
                         ,0x2f);
            local_200.filename = local_200.filename + 1;
            local_200.line = 0xb9;
            local_200.funcname = "DecodeAddress";
            AddressFormatData::GetString(&local_228,this_01,&local_148->prefix_key);
            local_208 = (char *)::std::__cxx11::string::c_str();
            logger::trace<int&,char_const*>
                      (&local_200,"fail libwally. ret={} prefix={}",&local_b8,&local_208);
            ::std::__cxx11::string::~string((string *)&local_228);
            wally_string = extraout_RDX_04;
          }
        }
      }
      if (local_b8 == 0) {
        WallyUtil::ConvertStringAndFree_abi_cxx11_(&local_260,local_78,wally_string);
        ::std::__cxx11::string::operator=((string *)&output,(string *)&local_260);
        ::std::__cxx11::string::~string((string *)&local_260);
        core::Address::Address(&local_3d8,(string *)&output,this_01);
        core::Address::operator=(&this->unblinded_address_,&local_3d8);
        core::Address::~Address(&local_3d8);
        ByteData::ByteData((ByteData *)&except,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
        Pubkey::Pubkey(&local_3f0,(ByteData *)&except);
        Pubkey::operator=(&this->confidential_key_,&local_3f0);
        Pubkey::~Pubkey(&local_3f0);
        ByteData::~ByteData((ByteData *)&except);
        ::std::__cxx11::string::operator=((string *)&this->address_,(string *)confidential_address);
        format._4_4_ = 1;
        goto LAB_003112b8;
      }
      __gnu_cxx::
      __normal_iterator<cfd::core::ElementsBlindAddressFormat_*,_std::vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>_>
      ::operator++(&__end3);
    }
    format._4_4_ = 4;
LAB_003112b8:
    ::std::
    vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
    ::~vector((vector<cfd::core::ElementsBlindAddressFormat,_std::allocator<cfd::core::ElementsBlindAddressFormat>_>
               *)&__begin3);
    if (format._4_4_ != 4) {
      ::std::__cxx11::string::~string((string *)local_e0);
      ::std::__cxx11::string::~string((string *)&output);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
      return;
    }
    __gnu_cxx::
    __normal_iterator<const_cfd::core::AddressFormatData_*,_std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void ElementsConfidentialAddress::DecodeAddress(
    const std::string& confidential_address,
    const std::vector<AddressFormatData>& prefix_list) {
  std::vector<uint8_t> pubkey_data(Pubkey::kCompressedPubkeySize);
  std::string address;
  char* output = nullptr;

  if (confidential_address.empty()) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. confidential address empty."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError, "DecodeAddress confidential address empty.");
  }

  int ret = -1;
  uint32_t prefix = 0;
  std::string hrp;
  bool is_find_blinded_prefix = false;
  for (const auto& data : prefix_list) {
    for (const auto& format : GetBlindKeyPair()) {
      try {
        output = nullptr;

        // Get confidential_key
        if (format.is_segwit) {
          hrp = data.GetString(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_segwit_to_ec_public_key(
              confidential_address.c_str(), hrp.c_str(), pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret, hrp);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        } else {
          prefix = data.GetValue(format.blinded_prefix_key);
          is_find_blinded_prefix = true;
          ret = wally_confidential_addr_to_ec_public_key(
              confidential_address.c_str(), prefix, pubkey_data.data(),
              pubkey_data.size());
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
            trace(
                CFD_LOG_SOURCE, "confidential_address={}",
                confidential_address);
          }
        }

        if (ret != WALLY_OK) {
          // do nothing
        } else if (format.is_segwit) {
          ret = wally_confidential_addr_to_addr_segwit(
              confidential_address.c_str(), hrp.c_str(),
              data.GetString(format.prefix_key).c_str(), &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                data.GetString(format.prefix_key).c_str());
          }
        } else {
          ret = wally_confidential_addr_to_addr(
              confidential_address.c_str(), prefix, &output);
          if (ret != WALLY_OK) {
            trace(
                CFD_LOG_SOURCE, "fail libwally. ret={} prefix={}", ret,
                prefix);
          }
        }

        if (ret == WALLY_OK) {
          address = WallyUtil::ConvertStringAndFree(output);
          unblinded_address_ = Address(address, data);
          confidential_key_ = ConfidentialKey(ByteData(pubkey_data));
          address_ = confidential_address;
          return;
        }
      } catch (const CfdException& except) {
        // Ignore
        trace(
            CFD_LOG_SOURCE, "DecodeAddress exception={}",
            std::string(except.what()));
      }
    }
  }

  if (is_find_blinded_prefix) {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not found."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not found.");
  } else {
    warn(
        CFD_LOG_SOURCE,
        "DecodeAddress error. ConfidentialAddress prefix not registed."
        " : address={}.",
        confidential_address);
    throw CfdException(
        kCfdIllegalArgumentError,
        "DecodeAddress confidential address prefix not registed.");
  }
}